

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O0

LispPTR compare_lisp_chars(char *char1,char *char2,DLword length,DLword fat1,DLword fat2)

{
  int iVar1;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  DLword fat2_local;
  DLword fat1_local;
  char *pcStack_20;
  DLword length_local;
  char *char2_local;
  char *char1_local;
  
  if ((fat1 == 0) == (fat2 == 0)) {
    if (fat1 == 0) {
      pcStack_20 = char2;
      char2_local = char1;
      for (local_30 = 0; local_30 < (int)(uint)length; local_30 = local_30 + 1) {
        if (*(char *)((ulong)char2_local ^ 3) != *(char *)((ulong)pcStack_20 ^ 3)) {
          return 0;
        }
        pcStack_20 = pcStack_20 + 1;
        char2_local = char2_local + 1;
      }
      char1_local._4_4_ = 1;
    }
    else {
      pcStack_20 = char2;
      char2_local = char1;
      for (local_2c = 0; local_2c < (int)(uint)length; local_2c = local_2c + 1) {
        if (*(short *)((ulong)char2_local ^ 2) != *(short *)((ulong)pcStack_20 ^ 2)) {
          return 0;
        }
        char2_local = char2_local + 2;
        pcStack_20 = pcStack_20 + 2;
      }
      char1_local._4_4_ = 1;
    }
  }
  else if (fat1 == 0) {
    iVar1 = lispcmp((DLword *)char2,char1,(uint)length);
    if (iVar1 == 0) {
      char1_local._4_4_ = 0;
    }
    else {
      char1_local._4_4_ = 1;
    }
  }
  else {
    iVar1 = lispcmp((DLword *)char1,char2,(uint)length);
    if (iVar1 == 0) {
      char1_local._4_4_ = 0;
    }
    else {
      char1_local._4_4_ = 1;
    }
  }
  return char1_local._4_4_;
}

Assistant:

LispPTR compare_lisp_chars(const char *char1, const char *char2, DLword length,
                           DLword fat1, DLword fat2) {
  if ((!fat1) == (!fat2)) { /* both fat or both non-fat. */
#ifdef BYTESWAP
    if (fat1) { /* both fat, so compare 'em a word at a time */
      int i;
      for (i = 0; i < length; i++) {
        if (GETWORD(char1) != GETWORD(char2)) return (NIL);
        /* increment by size of fat character, i.e., DLword, 2 bytes */
        char1+= sizeof(DLword); char2+=sizeof(DLword);
      }
      return (T);
    } else { /* both thin, so compare 'em a byte at a time */
             /* (it's this way in case we're byte-swapped.)*/
      int i;
      for (i = 0; i < length; i++)
        if (GETBYTE(char1++) != GETBYTE(char2++)) return (NIL);
      return (T);
    }
#else
    /* This one fails for byte-swapped machines */
    if (fat1) length = length + length;
    if (memcmp(char1, char2, length) == 0)
      return (T);
    else {
      return (NIL);
    }
#endif /* BYTESWAP */

  } else if (fat1) { /* char1 is fat, char2 isn't */
      if (lispcmp((const DLword *)char1, char2, length))
      return (T);
    else
      return (NIL);
  } else { /* char2 is fat, char1 isn't */
      if (lispcmp((const DLword *)char2, char1, length))
      return (T);
    else
      return (NIL);
  }

}